

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O3

void __thiscall
duckdb::TupleDataAllocator::Build
          (TupleDataAllocator *this,TupleDataSegment *segment,TupleDataPinState *pin_state,
          TupleDataChunkState *chunk_state,idx_t append_offset,idx_t append_count)

{
  uint uVar1;
  pointer pTVar2;
  TupleDataLayout *pTVar3;
  value_type vVar4;
  pointer prVar5;
  pointer ppVar6;
  iterator __position;
  TupleDataPinState *pin_state_00;
  idx_t iVar7;
  data_ptr_t pdVar8;
  TupleDataChunkPart *pTVar9;
  BufferHandle *pBVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  idx_t iVar13;
  pair<unsigned_long,_unsigned_long> *indices;
  pointer ppVar14;
  unsigned_long *aggr_idx;
  size_type *psVar15;
  iterator __position_00;
  ulong uVar16;
  ulong uVar17;
  uint32_t local_b4;
  TupleDataChunkState *local_b0;
  idx_t local_a8;
  TupleDataPinState *local_a0;
  unsafe_vector<TupleDataChunk> *local_98;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_90;
  idx_t local_88;
  TupleDataSegment *local_80;
  TupleDataChunk *local_78;
  idx_t local_70;
  data_ptr_t local_68;
  size_type *local_60;
  TupleDataChunkPart local_58;
  
  pTVar2 = (segment->chunks).
           super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b0 = chunk_state;
  local_a8 = append_offset;
  if ((segment->chunks).
      super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
      super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar2) {
    ReleaseOrStoreHandles(this,pin_state,segment,pTVar2 + -1,true);
  }
  ppVar14 = (this->chunk_part_indices).
            super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            .
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->chunk_part_indices).
      super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar14) {
    (this->chunk_part_indices).
    super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar14;
  }
  if (append_count != 0) {
    local_98 = &segment->chunks;
    local_90 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->chunk_part_indices;
    iVar13 = 0;
    local_a0 = pin_state;
    local_88 = append_count;
    local_80 = segment;
    do {
      iVar7 = local_88;
      pin_state_00 = local_a0;
      __position_00._M_current =
           (segment->chunks).
           super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (((segment->chunks).
           super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           _M_impl.super__Vector_impl_data._M_start == __position_00._M_current) ||
         (__position_00._M_current[-1].count == 0x800)) {
        if (__position_00._M_current ==
            (segment->chunks).
            super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::
          _M_realloc_insert<>(&local_98->
                               super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
                              ,__position_00);
          __position_00._M_current =
               (segment->chunks).
               super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          TupleDataChunk::TupleDataChunk(__position_00._M_current);
          __position_00._M_current =
               (segment->chunks).
               super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
          (segment->chunks).
          super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
          super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current;
        }
      }
      uVar16 = 0x800 - __position_00._M_current[-1].count;
      if (iVar7 - iVar13 < uVar16) {
        uVar16 = iVar7 - iVar13;
      }
      local_78 = __position_00._M_current;
      local_70 = iVar13;
      BuildChunkPart(&local_58,this,pin_state_00,local_b0,iVar13 + local_a8,uVar16,
                     __position_00._M_current + -1);
      pTVar9 = TupleDataChunk::AddPart(__position_00._M_current + -1,segment,&local_58);
      uVar1 = pTVar9->count;
      uVar16 = (ulong)uVar1;
      segment->count = segment->count + uVar16;
      pTVar3 = this->layout;
      iVar13 = pTVar3->row_width * uVar16 + segment->data_size;
      segment->data_size = iVar13;
      if (pTVar3->all_constant == false) {
        segment->data_size = iVar13 + pTVar9->total_heap_size;
      }
      if ((pTVar3->aggr_destructor_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
          .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pTVar3->aggr_destructor_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
          .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar10 = PinRowBlock(this,local_a0,pTVar9);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar10->node);
        psVar15 = (this->layout->aggr_destructor_idxs).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_60 = (this->layout->aggr_destructor_idxs).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (psVar15 != local_60) {
          local_68 = ((pBVar10->node).ptr)->buffer + pTVar9->row_block_offset;
          do {
            pTVar3 = this->layout;
            pvVar11 = vector<unsigned_long,_true>::operator[]
                                (&pTVar3->offsets,
                                 ((long)(pTVar3->types).
                                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        .
                                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar3->types).
                                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        .
                                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555 + *psVar15);
            pdVar8 = local_68;
            vVar4 = *pvVar11;
            pvVar12 = vector<duckdb::AggregateObject,_true>::operator[]
                                (&this->layout->aggregates,*psVar15);
            if (uVar1 != 0) {
              uVar17 = 0;
              do {
                FastMemset(pdVar8 + this->layout->row_width * uVar17 + vVar4,0,pvVar12->payload_size
                          );
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
            }
            psVar15 = psVar15 + 1;
          } while (psVar15 != local_60);
        }
      }
      segment = local_80;
      iVar13 = local_70 + uVar16;
      local_58._0_8_ =
           ((long)(local_80->chunks).
                  super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_80->chunks).
                  super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                  super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + -1;
      local_b4 = local_78[-1].part_ids.max_id;
      ::std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long,unsigned_int>(local_90,(unsigned_long *)&local_58,&local_b4);
      pin_state = local_a0;
    } while (iVar13 != local_88);
  }
  prVar5 = (this->chunk_parts).
           super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->chunk_parts).
      super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar5) {
    (this->chunk_parts).
    super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = prVar5;
  }
  ppVar6 = (this->chunk_part_indices).
           super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           .
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar14 = (this->chunk_part_indices).
                 super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar6; ppVar14 = ppVar14 + 1
      ) {
    pTVar9 = (segment->chunk_parts).
             super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>.
             super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
             ._M_impl.super__Vector_impl_data._M_start + ppVar14->second;
    __position._M_current =
         (this->chunk_parts).
         super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->chunk_parts).
        super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>>>
      ::_M_realloc_insert<duckdb::TupleDataChunkPart&>
                ((vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>>>
                  *)&this->chunk_parts,__position,pTVar9);
    }
    else {
      (__position._M_current)->_M_data = pTVar9;
      (this->chunk_parts).
      super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  InitializeChunkStateInternal(this,pin_state,local_b0,local_a8,false,true,false,&this->chunk_parts)
  ;
  TupleDataChunk::MergeLastChunkPart
            ((segment->chunks).
             super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             _M_impl.super__Vector_impl_data._M_start +
             ((this->chunk_part_indices).
              super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              .
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->first,segment);
  return;
}

Assistant:

void TupleDataAllocator::Build(TupleDataSegment &segment, TupleDataPinState &pin_state,
                               TupleDataChunkState &chunk_state, const idx_t append_offset, const idx_t append_count) {
	D_ASSERT(this == segment.allocator.get());
	auto &chunks = segment.chunks;
	if (!chunks.empty()) {
		ReleaseOrStoreHandles(pin_state, segment, chunks.back(), true);
	}

	// Build the chunk parts for the incoming data
	chunk_part_indices.clear();
	idx_t offset = 0;
	while (offset != append_count) {
		if (chunks.empty() || chunks.back().count == STANDARD_VECTOR_SIZE) {
			chunks.emplace_back();
		}
		auto &chunk = chunks.back();

		// Build the next part
		auto next = MinValue<idx_t>(append_count - offset, STANDARD_VECTOR_SIZE - chunk.count);
		auto &chunk_part =
		    chunk.AddPart(segment, BuildChunkPart(pin_state, chunk_state, append_offset + offset, next, chunk));
		next = chunk_part.count;

		segment.count += next;
		segment.data_size += chunk_part.count * layout.GetRowWidth();
		if (!layout.AllConstant()) {
			segment.data_size += chunk_part.total_heap_size;
		}

		if (layout.HasDestructor()) {
			const auto base_row_ptr = GetRowPointer(pin_state, chunk_part);
			for (auto &aggr_idx : layout.GetAggregateDestructorIndices()) {
				const auto aggr_offset = layout.GetOffsets()[layout.ColumnCount() + aggr_idx];
				auto &aggr_fun = layout.GetAggregates()[aggr_idx];
				for (idx_t i = 0; i < next; i++) {
					duckdb::FastMemset(base_row_ptr + i * layout.GetRowWidth() + aggr_offset, '\0',
					                   aggr_fun.payload_size);
				}
			}
		}

		offset += next;
		chunk_part_indices.emplace_back(chunks.size() - 1, chunk.part_ids.End() - 1);
	}

	// Now initialize the pointers to write the data to
	chunk_parts.clear();
	for (const auto &indices : chunk_part_indices) {
		chunk_parts.emplace_back(segment.chunk_parts[indices.second]);
	}
	InitializeChunkStateInternal(pin_state, chunk_state, append_offset, false, true, false, chunk_parts);

	// To reduce metadata, we try to merge chunk parts where possible
	// Due to the way chunk parts are constructed, only the last part of the first chunk is eligible for merging
	segment.chunks[chunk_part_indices[0].first].MergeLastChunkPart(segment);

	segment.Verify();
}